

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O2

bool lunasvg::parseUrlValue(string_view *input,string *value)

{
  char delimiter;
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  string_view local_28;
  
  local_28._M_len = 3;
  local_28._M_str = "url";
  bVar1 = skipString(input,&local_28);
  if (!bVar1) {
    return false;
  }
  bVar1 = skipOptionalSpaces(input);
  if (!bVar1) {
    return false;
  }
  bVar1 = skipDelimiter(input,'(');
  if (!bVar1) {
    return false;
  }
  bVar1 = skipOptionalSpaces(input);
  if (bVar1) {
    pcVar2 = input->_M_str;
    delimiter = *pcVar2;
    if ((delimiter == '\"') || (delimiter == '\'')) {
      input->_M_str = pcVar2 + 1;
      input->_M_len = input->_M_len - 1;
      skipOptionalSpaces(input);
      bVar1 = skipDelimiter(input,'#');
      if (!bVar1) {
        return false;
      }
      sVar3 = input->_M_len;
      while ((sVar3 != 0 && (*input->_M_str != delimiter))) {
        std::__cxx11::string::push_back((char)value);
        input->_M_str = input->_M_str + 1;
        sVar3 = input->_M_len - 1;
        input->_M_len = sVar3;
      }
      skipOptionalSpaces(input);
      bVar1 = skipDelimiter(input,delimiter);
      if (!bVar1) {
        return false;
      }
    }
    else {
      if (delimiter != '#') {
        return false;
      }
      while( true ) {
        input->_M_str = pcVar2 + 1;
        input->_M_len = input->_M_len - 1;
        if ((input->_M_len == 0) || (pcVar2[1] == ')')) break;
        std::__cxx11::string::push_back((char)value);
        pcVar2 = input->_M_str;
      }
    }
    bVar1 = skipOptionalSpaces(input);
    if (!bVar1) {
      return false;
    }
    bVar1 = skipDelimiter(input,')');
    return bVar1;
  }
  return false;
}

Assistant:

static bool parseUrlValue(std::string_view& input, std::string& value)
{
    if(!skipString(input, "url")
        || !skipOptionalSpaces(input)
        || !skipDelimiter(input, '(')
        || !skipOptionalSpaces(input)) {
        return false;
    }

    switch(input.front()) {
    case '\'':
    case '\"': {
        auto delim = input.front();
        input.remove_prefix(1);
        skipOptionalSpaces(input);
        if(!skipDelimiter(input, '#'))
            return false;
        while(!input.empty() && input.front() != delim) {
            value += input.front();
            input.remove_prefix(1);
        }

        skipOptionalSpaces(input);
        if(!skipDelimiter(input, delim))
            return false;
        break;
    } case '#': {
        input.remove_prefix(1);
        while(!input.empty() && input.front() != ')') {
            value += input.front();
            input.remove_prefix(1);
        }

        break;
    } default:
        return false;
    }

    return skipOptionalSpaces(input) && skipDelimiter(input, ')');
}